

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O1

int sam_bam_cram_readrec(BGZF *bgzfp,void *fpv,void *bv,int *tid,int *beg,int *end)

{
  uint uVar1;
  int iVar2;
  uint *__ptr;
  uint uVar3;
  uint extraout_EDX;
  uint uVar4;
  long lVar5;
  bam1_t *b;
  bam_seq_t *apbStack_58 [2];
  uint uStack_44;
  int iStack_40;
  uint uStack_3c;
  bam_seq_t *local_8;
  
  uVar3 = (uint)tid;
  local_8 = (bam_seq_t *)bv;
  if (*(int *)((long)fpv + 0x44) == 6) {
    iVar2 = cram_get_bam_seq(*(cram_fd **)((long)fpv + 0x38),&local_8);
    return iVar2;
  }
  if (*(int *)((long)fpv + 0x44) == 4) {
    iVar2 = bam_read1(bgzfp,(bam1_t *)bv);
    return iVar2;
  }
  sam_bam_cram_readrec_cold_1();
  lVar5 = 0x50;
  apbStack_58[0] = (bam_seq_t *)0x139081;
  __ptr = (uint *)calloc(1,0x50);
  if (__ptr != (uint *)0x0) {
    uVar1 = *__ptr;
    *__ptr = uVar1 | 1;
    __ptr[0xc] = 0;
    __ptr[0xd] = 0;
    __ptr[0x12] = 0;
    __ptr[0x13] = 0;
    *(int **)(__ptr + 0xe) = beg;
    uVar4 = (uint)fpv;
    if ((int)uVar4 < 0) {
      if (uVar4 == 0xfffffffb) {
        __ptr[10] = 0;
        __ptr[0xb] = 0;
        *__ptr = uVar1 | 3;
      }
      else {
        if (uVar4 != 0xfffffffc) {
          apbStack_58[0] = (bam_seq_t *)cram_readrec;
          cram_itr_query_cold_1();
          iVar2 = cram_get_bam_seq(*(cram_fd **)(lVar5 + 0x38),apbStack_58);
          return iVar2;
        }
        __ptr[10] = 0;
        __ptr[0xb] = 0;
      }
      goto LAB_00139106;
    }
    iStack_40 = extraout_EDX + 1;
    apbStack_58[0] = (bam_seq_t *)0x1390c7;
    uStack_44 = uVar4;
    uStack_3c = uVar3;
    iVar2 = cram_set_option(*(cram_fd **)&bgzfp->block_length,CRAM_OPT_RANGE);
    if (iVar2 == 0) {
      __ptr[10] = 0;
      __ptr[0xb] = 0;
      __ptr[1] = uVar4;
      __ptr[2] = extraout_EDX;
      __ptr[3] = uVar3;
      goto LAB_00139106;
    }
    apbStack_58[0] = (bam_seq_t *)0x1390d6;
    free(__ptr);
  }
  __ptr = (uint *)0x0;
LAB_00139106:
  return (int)__ptr;
}

Assistant:

static int sam_bam_cram_readrec(BGZF *bgzfp, void *fpv, void *bv, int *tid, int *beg, int *end)
{
    htsFile *fp = fpv;
    bam1_t *b = bv;
    switch (fp->format.format) {
    case bam:   return bam_read1(bgzfp, b);
    case cram:  return cram_get_bam_seq(fp->fp.cram, &b);
    default:
        // TODO Need headers available to implement this for SAM files
        fprintf(stderr, "[sam_bam_cram_readrec] Not implemented for SAM files -- Exiting\n");
        abort();
    }
}